

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O2

void nni_http_chunks_free(nni_http_chunks *cl)

{
  void *item;
  
  if (cl == (nni_http_chunks *)0x0) {
    return;
  }
  while (item = nni_list_first(&cl->cl_chunks), item != (void *)0x0) {
    nni_list_remove(&cl->cl_chunks,item);
    if (*(void **)((long)item + 0x28) != (void *)0x0) {
      nni_free(*(void **)((long)item + 0x28),*(size_t *)((long)item + 0x18));
    }
    nni_free(item,0x30);
  }
  nni_free(cl,0x38);
  return;
}

Assistant:

void
nni_http_chunks_free(nni_http_chunks *cl)
{
	nni_http_chunk *ch;
	if (cl == NULL) {
		return;
	}
	while ((ch = nni_list_first(&cl->cl_chunks)) != NULL) {
		nni_list_remove(&cl->cl_chunks, ch);
		if (ch->c_data != NULL) {
			nni_free(ch->c_data, ch->c_alloc);
		}
		NNI_FREE_STRUCT(ch);
	}
	NNI_FREE_STRUCT(cl);
}